

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringClass.cpp
# Opt level: O0

bool __thiscall String::maskAgainst(String *this,String *pattern)

{
  bool bVar1;
  char end;
  char *pcStack_88;
  char *sptr;
  char *mptr;
  char *maskstring;
  undefined1 local_60 [8];
  String this_upper;
  String pattern_upper;
  String *pattern_local;
  String *this_local;
  
  toUppercase((String *)&this_upper.field_0x18,pattern);
  toUppercase((String *)local_60,this);
  sptr = c_str((String *)&this_upper.field_0x18);
  pcStack_88 = c_str((String *)local_60);
  do {
    if (*pcStack_88 == '\0') {
      this_local._7_1_ = true;
LAB_0017057a:
      ~String((String *)local_60);
      ~String((String *)&this_upper.field_0x18);
      return this_local._7_1_;
    }
    if (*sptr == '?') {
      if (pcStack_88[1] == '\0') {
        this_local._7_1_ = false;
        goto LAB_0017057a;
      }
    }
    else if (*sptr == '*') {
      if (sptr[1] == '\0') {
        this_local._7_1_ = true;
        goto LAB_0017057a;
      }
      while( true ) {
        bVar1 = false;
        if (*pcStack_88 != sptr[1]) {
          bVar1 = *pcStack_88 != '\0';
        }
        if (!bVar1) break;
        pcStack_88 = pcStack_88 + 1;
      }
      sptr = sptr + 1;
      if (*pcStack_88 == '\0') {
        this_local._7_1_ = false;
        goto LAB_0017057a;
      }
    }
    else if (*pcStack_88 != *sptr) {
      this_local._7_1_ = false;
      goto LAB_0017057a;
    }
    sptr = sptr + 1;
    pcStack_88 = pcStack_88 + 1;
  } while( true );
}

Assistant:

bool String::maskAgainst (const String& pattern) const
{
	// Elevate to uppercase for case-insensitive matching
	String pattern_upper = pattern.toUppercase();
	String this_upper = toUppercase();
	const char* maskstring = pattern_upper.c_str();
	const char* mptr = &maskstring[0];

	for (const char* sptr = this_upper.c_str(); *sptr != '\0'; sptr++)
	{
		if (*mptr == '?')
		{
			if (*(sptr + 1) == '\0')
			{
				// ? demands that there's a character here and there wasn't.
				// Therefore, mask matching fails
				return false;
			}
		}
		elif (*mptr == '*')
		{
			char end = *(++mptr);

			// If '*' is the final character of the message, all of the remaining
			// string matches against the '*'. We don't need to bother checking
			// the string any further.
			if (end == '\0')
				return true;

			// Skip to the end character
			while (*sptr != end and *sptr != '\0')
				sptr++;

			// String ended while the mask still had stuff
			if (*sptr == '\0')
				return false;
		}
		elif (*sptr != *mptr)
			return false;

		mptr++;
	}

	return true;
}